

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gridded_Data_PDU.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::PDU::Gridded_Data_PDU::operator==(Gridded_Data_PDU *this,Gridded_Data_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  
  KVar1 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if (((((!KVar1) &&
        (KVar1 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_EnvProcID,&Value->m_EnvProcID),
        !KVar1)) && (this->m_ui16FieldNum == Value->m_ui16FieldNum)) &&
      ((((this->m_ui16PDUNum == Value->m_ui16PDUNum &&
         (this->m_ui16PDUTotal == Value->m_ui16PDUTotal)) &&
        ((this->m_ui16CordSys == Value->m_ui16CordSys &&
         ((this->m_ui8NumAxis == Value->m_ui8NumAxis &&
          (this->m_ui8ConstGrid == Value->m_ui8ConstGrid)))))) &&
       (KVar1 = DATA_TYPE::EnvironmentType::operator!=(&this->m_EnvType,&Value->m_EnvType), !KVar1))
      )) && ((((KVar1 = DATA_TYPE::EulerAngles::operator!=(&this->m_Ori,&Value->m_Ori), !KVar1 &&
               (this->m_ui64SampleTime == Value->m_ui64SampleTime)) &&
              (this->m_ui32TotalValues == Value->m_ui32TotalValues)) &&
             ((this->m_ui8VecDim == Value->m_ui8VecDim &&
              (bVar2 = std::operator!=(&this->m_vpGridAxisDesc,&Value->m_vpGridAxisDesc), !bVar2))))
            )) {
    bVar2 = std::operator!=(&this->m_vGridData,&Value->m_vGridData);
    return !bVar2;
  }
  return false;
}

Assistant:

KBOOL Gridded_Data_PDU::operator == ( const Gridded_Data_PDU & Value ) const
{
    if( Header::operator  != ( Value ) )               return false;
    if( m_EnvProcID       != Value.m_EnvProcID )       return false;
    if( m_ui16FieldNum    != Value.m_ui16FieldNum )    return false;
    if( m_ui16PDUNum      != Value.m_ui16PDUNum )      return false;
    if( m_ui16PDUTotal    != Value.m_ui16PDUTotal )    return false;
    if( m_ui16CordSys     != Value.m_ui16CordSys )     return false;
    if( m_ui8NumAxis      != Value.m_ui8NumAxis )      return false;
    if( m_ui8ConstGrid    != Value.m_ui8ConstGrid )    return false;
    if( m_EnvType         != Value.m_EnvType )         return false;
    if( m_Ori             != Value.m_Ori )             return false;
    if( m_ui64SampleTime  != Value.m_ui64SampleTime )  return false;
    if( m_ui32TotalValues != Value.m_ui32TotalValues ) return false;
    if( m_ui8VecDim       != Value.m_ui8VecDim )       return false;
    if( m_vpGridAxisDesc  != Value.m_vpGridAxisDesc )  return false;
    if( m_vGridData       != Value.m_vGridData )       return false;
    return true;
}